

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O1

void blockmix_salsa8(salsa20_blk_t *Bin,salsa20_blk_t *Bout,size_t r)

{
  long lVar1;
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  long lVar7;
  int iVar8;
  uint32_t uVar9;
  int iVar23;
  int iVar24;
  __m128i Y0;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar25;
  __m128i Y1;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint uVar38;
  int iVar39;
  uint uVar53;
  uint uVar55;
  undefined1 auVar40 [16];
  uint uVar57;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar54;
  int iVar56;
  int iVar58;
  undefined1 auVar52 [16];
  __m128i Y3;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar71;
  uint uVar86;
  uint uVar87;
  uint uVar88;
  __m128i Y0_1;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint uVar89;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar90;
  uint uVar91;
  uint uVar105;
  uint uVar106;
  __m128i Y1_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  uint uVar107;
  uint uVar108;
  uint uVar121;
  uint uVar122;
  __m128i Y3_1;
  uint uVar123;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  uint uVar149;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  uint uVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  
  lVar1 = r - 1;
  for (lVar7 = lVar1; lVar7 != 0; lVar7 = lVar7 + -1) {
  }
  uVar9 = Bin[lVar1 * 2 + 1].w[0];
  uVar86 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x44);
  uVar88 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x48);
  uVar90 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x4c);
  uVar38 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x50);
  uVar53 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x54);
  uVar55 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x58);
  uVar57 = *(uint *)((long)Bin + lVar1 * 0x80 + 0x5c);
  auVar40 = *(undefined1 (*) [16])((long)Bin + lVar1 * 0x80 + 0x60);
  lVar7 = r + (r == 0);
  auVar59 = *(undefined1 (*) [16])((long)Bin + lVar1 * 0x80 + 0x70);
  pauVar5 = (undefined1 (*) [16])(Bout->w + 0xc);
  pauVar6 = (undefined1 (*) [16])((long)Bin + 0x70);
  do {
    uVar71 = uVar9 ^ *(uint *)pauVar6[-7];
    uVar86 = uVar86 ^ *(uint *)(pauVar6[-7] + 4);
    uVar88 = uVar88 ^ *(uint *)(pauVar6[-7] + 8);
    uVar90 = uVar90 ^ *(uint *)(pauVar6[-7] + 0xc);
    uVar38 = uVar38 ^ *(uint *)pauVar6[-6];
    uVar53 = uVar53 ^ *(uint *)(pauVar6[-6] + 4);
    uVar55 = uVar55 ^ *(uint *)(pauVar6[-6] + 8);
    uVar57 = uVar57 ^ *(uint *)(pauVar6[-6] + 0xc);
    auVar59 = auVar59 ^ pauVar6[-4];
    uVar108 = auVar59._0_4_ + uVar71;
    uVar121 = auVar59._4_4_ + uVar86;
    uVar122 = auVar59._8_4_ + uVar88;
    uVar123 = auVar59._12_4_ + uVar90;
    auVar40 = auVar40 ^ pauVar6[-5];
    uVar91 = (uVar108 * 0x80 | uVar108 >> 0x19) ^ uVar38;
    uVar107 = (uVar121 * 0x80 | uVar121 >> 0x19) ^ uVar53;
    uVar105 = (uVar122 * 0x80 | uVar122 >> 0x19) ^ uVar55;
    uVar106 = (uVar123 * 0x80 | uVar123 >> 0x19) ^ uVar57;
    auVar72._0_4_ = uVar91 + uVar71 >> 0x17;
    auVar72._4_4_ = uVar107 + uVar86 >> 0x17;
    auVar72._8_4_ = uVar105 + uVar88 >> 0x17;
    auVar72._12_4_ = uVar106 + uVar90 >> 0x17;
    auVar92._0_4_ = (uVar91 + uVar71) * 0x200;
    auVar92._4_4_ = (uVar107 + uVar86) * 0x200;
    auVar92._8_4_ = (uVar105 + uVar88) * 0x200;
    auVar92._12_4_ = (uVar106 + uVar90) * 0x200;
    auVar93 = (auVar92 | auVar72) ^ auVar40;
    iVar8 = auVar93._0_4_;
    iVar23 = auVar93._4_4_;
    uVar108 = auVar93._8_4_ + uVar105;
    uVar121 = auVar93._12_4_ + uVar106;
    auVar73._0_4_ = (iVar8 + uVar91) * 0x2000;
    auVar73._4_4_ = (iVar23 + uVar107) * 0x2000;
    auVar73._8_4_ = uVar108 * 0x2000;
    auVar73._12_4_ = uVar121 * 0x2000;
    auVar124._0_4_ = iVar8 + uVar91 >> 0x13;
    auVar124._4_4_ = iVar23 + uVar107 >> 0x13;
    auVar124._8_4_ = uVar108 >> 0x13;
    auVar124._12_4_ = uVar121 >> 0x13;
    auVar74 = (auVar73 | auVar124) ^ auVar59;
    auVar151._0_12_ = auVar74._4_12_;
    auVar151._12_4_ = auVar74._0_4_;
    uVar108 = auVar74._0_4_ + iVar8;
    uVar122 = auVar74._4_4_ + iVar23;
    uVar87 = auVar74._8_4_ + auVar93._8_4_;
    uVar89 = auVar74._12_4_ + auVar93._12_4_;
    uVar121 = (uVar108 * 0x40000 | uVar108 >> 0xe) ^ uVar71;
    uVar123 = (uVar122 * 0x40000 | uVar122 >> 0xe) ^ uVar86;
    uVar149 = (uVar87 * 0x40000 | uVar87 >> 0xe) ^ uVar88;
    uVar150 = (uVar89 * 0x40000 | uVar89 >> 0xe) ^ uVar90;
    auVar96._4_4_ = uVar91;
    auVar96._0_4_ = uVar106;
    auVar96._8_4_ = uVar107;
    auVar96._12_4_ = uVar105;
    auVar109._0_4_ = (uVar106 + uVar121) * 0x80;
    auVar109._4_4_ = (uVar91 + uVar123) * 0x80;
    auVar109._8_4_ = (uVar107 + uVar149) * 0x80;
    auVar109._12_4_ = (uVar105 + uVar150) * 0x80;
    auVar125._0_4_ = uVar106 + uVar121 >> 0x19;
    auVar125._4_4_ = uVar91 + uVar123 >> 0x19;
    auVar125._8_4_ = uVar107 + uVar149 >> 0x19;
    auVar125._12_4_ = uVar105 + uVar150 >> 0x19;
    auVar125 = auVar125 ^ auVar109 ^ auVar151;
    iVar24 = auVar125._0_4_;
    iVar25 = auVar125._4_4_;
    iVar39 = auVar125._8_4_;
    iVar54 = auVar125._12_4_;
    auVar94._0_8_ = auVar93._8_8_;
    auVar94._8_4_ = iVar8;
    auVar94._12_4_ = iVar23;
    auVar152._0_4_ = (iVar24 + uVar121) * 0x200;
    auVar152._4_4_ = (iVar25 + uVar123) * 0x200;
    auVar152._8_4_ = (iVar39 + uVar149) * 0x200;
    auVar152._12_4_ = (iVar54 + uVar150) * 0x200;
    auVar110._0_4_ = iVar24 + uVar121 >> 0x17;
    auVar110._4_4_ = iVar25 + uVar123 >> 0x17;
    auVar110._8_4_ = iVar39 + uVar149 >> 0x17;
    auVar110._12_4_ = iVar54 + uVar150 >> 0x17;
    auVar110 = auVar110 ^ auVar152 ^ auVar94;
    iVar8 = auVar110._0_4_;
    iVar23 = auVar110._4_4_;
    uVar108 = auVar110._8_4_ + iVar39;
    uVar122 = auVar110._12_4_ + iVar54;
    auVar153._0_4_ = (uint)(iVar8 + iVar24) >> 0x13;
    auVar153._4_4_ = (uint)(iVar23 + iVar25) >> 0x13;
    auVar153._8_4_ = uVar108 >> 0x13;
    auVar153._12_4_ = uVar122 >> 0x13;
    auVar95._0_4_ = (iVar8 + iVar24) * 0x2000;
    auVar95._4_4_ = (iVar23 + iVar25) * 0x2000;
    auVar95._8_4_ = uVar108 * 0x2000;
    auVar95._12_4_ = uVar122 * 0x2000;
    auVar96 = (auVar95 | auVar153) ^ auVar96;
    auVar154._0_12_ = auVar96._4_12_;
    auVar154._12_4_ = auVar96._0_4_;
    uVar108 = auVar96._0_4_ + iVar8;
    uVar122 = auVar96._4_4_ + iVar23;
    uVar87 = auVar96._8_4_ + auVar110._8_4_;
    uVar89 = auVar96._12_4_ + auVar110._12_4_;
    auVar78._4_4_ = iVar24;
    auVar78._0_4_ = iVar54;
    auVar78._8_4_ = iVar25;
    auVar78._12_4_ = iVar39;
    uVar121 = (uVar108 * 0x40000 | uVar108 >> 0xe) ^ uVar121;
    uVar123 = (uVar122 * 0x40000 | uVar122 >> 0xe) ^ uVar123;
    uVar149 = (uVar87 * 0x40000 | uVar87 >> 0xe) ^ uVar149;
    uVar150 = (uVar89 * 0x40000 | uVar89 >> 0xe) ^ uVar150;
    auVar75._0_4_ = (iVar54 + uVar121) * 0x80;
    auVar75._4_4_ = (iVar24 + uVar123) * 0x80;
    auVar75._8_4_ = (iVar25 + uVar149) * 0x80;
    auVar75._12_4_ = (iVar39 + uVar150) * 0x80;
    auVar126._0_4_ = iVar54 + uVar121 >> 0x19;
    auVar126._4_4_ = iVar24 + uVar123 >> 0x19;
    auVar126._8_4_ = iVar25 + uVar149 >> 0x19;
    auVar126._12_4_ = iVar39 + uVar150 >> 0x19;
    auVar126 = auVar126 ^ auVar75 ^ auVar154;
    auVar76._0_8_ = auVar110._8_8_;
    auVar76._8_4_ = iVar8;
    auVar76._12_4_ = iVar23;
    iVar24 = auVar126._0_4_;
    iVar25 = auVar126._4_4_;
    iVar39 = auVar126._8_4_;
    iVar54 = auVar126._12_4_;
    auVar155._0_4_ = (iVar24 + uVar121) * 0x200;
    auVar155._4_4_ = (iVar25 + uVar123) * 0x200;
    auVar155._8_4_ = (iVar39 + uVar149) * 0x200;
    auVar155._12_4_ = (iVar54 + uVar150) * 0x200;
    auVar111._0_4_ = iVar24 + uVar121 >> 0x17;
    auVar111._4_4_ = iVar25 + uVar123 >> 0x17;
    auVar111._8_4_ = iVar39 + uVar149 >> 0x17;
    auVar111._12_4_ = iVar54 + uVar150 >> 0x17;
    auVar111 = auVar111 ^ auVar155 ^ auVar76;
    iVar8 = auVar111._0_4_;
    iVar23 = auVar111._4_4_;
    uVar108 = auVar111._8_4_ + iVar39;
    uVar122 = auVar111._12_4_ + iVar54;
    auVar77._0_4_ = (iVar8 + iVar24) * 0x2000;
    auVar77._4_4_ = (iVar23 + iVar25) * 0x2000;
    auVar77._8_4_ = uVar108 * 0x2000;
    auVar77._12_4_ = uVar122 * 0x2000;
    auVar156._0_4_ = (uint)(iVar8 + iVar24) >> 0x13;
    auVar156._4_4_ = (uint)(iVar23 + iVar25) >> 0x13;
    auVar156._8_4_ = uVar108 >> 0x13;
    auVar156._12_4_ = uVar122 >> 0x13;
    auVar78 = (auVar77 | auVar156) ^ auVar78;
    uVar108 = auVar78._0_4_ + iVar8;
    uVar122 = auVar78._4_4_ + iVar23;
    uVar87 = auVar78._8_4_ + auVar111._8_4_;
    uVar89 = auVar78._12_4_ + auVar111._12_4_;
    uVar121 = (uVar108 * 0x40000 | uVar108 >> 0xe) ^ uVar121;
    uVar123 = (uVar122 * 0x40000 | uVar122 >> 0xe) ^ uVar123;
    uVar149 = (uVar87 * 0x40000 | uVar87 >> 0xe) ^ uVar149;
    uVar150 = (uVar89 * 0x40000 | uVar89 >> 0xe) ^ uVar150;
    auVar100._4_4_ = iVar24;
    auVar100._0_4_ = iVar54;
    auVar100._8_4_ = iVar25;
    auVar100._12_4_ = iVar39;
    auVar97._0_4_ = (iVar54 + uVar121) * 0x80;
    auVar97._4_4_ = (iVar24 + uVar123) * 0x80;
    auVar97._8_4_ = (iVar25 + uVar149) * 0x80;
    auVar97._12_4_ = (iVar39 + uVar150) * 0x80;
    auVar137._0_4_ = iVar54 + uVar121 >> 0x19;
    auVar137._4_4_ = iVar24 + uVar123 >> 0x19;
    auVar137._8_4_ = iVar25 + uVar149 >> 0x19;
    auVar137._12_4_ = iVar39 + uVar150 >> 0x19;
    auVar74._12_4_ = auVar78._0_4_;
    auVar74._0_12_ = auVar78._4_12_;
    auVar137 = auVar137 ^ auVar97 ^ auVar74;
    iVar24 = auVar137._0_4_;
    iVar25 = auVar137._4_4_;
    iVar39 = auVar137._8_4_;
    iVar54 = auVar137._12_4_;
    auVar98._0_8_ = auVar111._8_8_;
    auVar98._8_4_ = iVar8;
    auVar98._12_4_ = iVar23;
    auVar112._0_4_ = (iVar24 + uVar121) * 0x200;
    auVar112._4_4_ = (iVar25 + uVar123) * 0x200;
    auVar112._8_4_ = (iVar39 + uVar149) * 0x200;
    auVar112._12_4_ = (iVar54 + uVar150) * 0x200;
    auVar127._0_4_ = iVar24 + uVar121 >> 0x17;
    auVar127._4_4_ = iVar25 + uVar123 >> 0x17;
    auVar127._8_4_ = iVar39 + uVar149 >> 0x17;
    auVar127._12_4_ = iVar54 + uVar150 >> 0x17;
    auVar127 = auVar127 ^ auVar112 ^ auVar98;
    iVar8 = auVar127._0_4_;
    iVar23 = auVar127._4_4_;
    uVar108 = auVar127._8_4_ + iVar39;
    uVar122 = auVar127._12_4_ + iVar54;
    auVar113._0_4_ = (uint)(iVar8 + iVar24) >> 0x13;
    auVar113._4_4_ = (uint)(iVar23 + iVar25) >> 0x13;
    auVar113._8_4_ = uVar108 >> 0x13;
    auVar113._12_4_ = uVar122 >> 0x13;
    auVar99._0_4_ = (iVar8 + iVar24) * 0x2000;
    auVar99._4_4_ = (iVar23 + iVar25) * 0x2000;
    auVar99._8_4_ = uVar108 * 0x2000;
    auVar99._12_4_ = uVar122 * 0x2000;
    auVar100 = (auVar99 | auVar113) ^ auVar100;
    auVar114._0_12_ = auVar100._4_12_;
    auVar114._12_4_ = auVar100._0_4_;
    uVar108 = auVar100._0_4_ + iVar8;
    uVar122 = auVar100._4_4_ + iVar23;
    uVar87 = auVar100._8_4_ + auVar127._8_4_;
    uVar89 = auVar100._12_4_ + auVar127._12_4_;
    auVar82._4_4_ = iVar24;
    auVar82._0_4_ = iVar54;
    auVar82._8_4_ = iVar25;
    auVar82._12_4_ = iVar39;
    uVar121 = (uVar108 * 0x40000 | uVar108 >> 0xe) ^ uVar121;
    uVar123 = (uVar122 * 0x40000 | uVar122 >> 0xe) ^ uVar123;
    uVar149 = (uVar87 * 0x40000 | uVar87 >> 0xe) ^ uVar149;
    uVar150 = (uVar89 * 0x40000 | uVar89 >> 0xe) ^ uVar150;
    auVar79._0_4_ = (iVar54 + uVar121) * 0x80;
    auVar79._4_4_ = (iVar24 + uVar123) * 0x80;
    auVar79._8_4_ = (iVar25 + uVar149) * 0x80;
    auVar79._12_4_ = (iVar39 + uVar150) * 0x80;
    auVar138._0_4_ = iVar54 + uVar121 >> 0x19;
    auVar138._4_4_ = iVar24 + uVar123 >> 0x19;
    auVar138._8_4_ = iVar25 + uVar149 >> 0x19;
    auVar138._12_4_ = iVar39 + uVar150 >> 0x19;
    auVar138 = auVar138 ^ auVar79 ^ auVar114;
    auVar80._0_8_ = auVar127._8_8_;
    auVar80._8_4_ = iVar8;
    auVar80._12_4_ = iVar23;
    iVar24 = auVar138._0_4_;
    iVar25 = auVar138._4_4_;
    iVar39 = auVar138._8_4_;
    iVar54 = auVar138._12_4_;
    auVar128._0_4_ = (iVar24 + uVar121) * 0x200;
    auVar128._4_4_ = (iVar25 + uVar123) * 0x200;
    auVar128._8_4_ = (iVar39 + uVar149) * 0x200;
    auVar128._12_4_ = (iVar54 + uVar150) * 0x200;
    auVar115._0_4_ = iVar24 + uVar121 >> 0x17;
    auVar115._4_4_ = iVar25 + uVar123 >> 0x17;
    auVar115._8_4_ = iVar39 + uVar149 >> 0x17;
    auVar115._12_4_ = iVar54 + uVar150 >> 0x17;
    auVar115 = auVar115 ^ auVar128 ^ auVar80;
    iVar8 = auVar115._0_4_;
    iVar23 = auVar115._4_4_;
    uVar108 = auVar115._8_4_ + iVar39;
    uVar122 = auVar115._12_4_ + iVar54;
    auVar81._0_4_ = (iVar8 + iVar24) * 0x2000;
    auVar81._4_4_ = (iVar23 + iVar25) * 0x2000;
    auVar81._8_4_ = uVar108 * 0x2000;
    auVar81._12_4_ = uVar122 * 0x2000;
    auVar129._0_4_ = (uint)(iVar8 + iVar24) >> 0x13;
    auVar129._4_4_ = (uint)(iVar23 + iVar25) >> 0x13;
    auVar129._8_4_ = uVar108 >> 0x13;
    auVar129._12_4_ = uVar122 >> 0x13;
    auVar82 = (auVar81 | auVar129) ^ auVar82;
    auVar130._0_12_ = auVar82._4_12_;
    auVar130._12_4_ = auVar82._0_4_;
    uVar108 = auVar82._0_4_ + iVar8;
    uVar122 = auVar82._4_4_ + iVar23;
    uVar87 = auVar82._8_4_ + auVar115._8_4_;
    uVar89 = auVar82._12_4_ + auVar115._12_4_;
    uVar121 = (uVar108 * 0x40000 | uVar108 >> 0xe) ^ uVar121;
    uVar123 = (uVar122 * 0x40000 | uVar122 >> 0xe) ^ uVar123;
    uVar149 = (uVar87 * 0x40000 | uVar87 >> 0xe) ^ uVar149;
    uVar150 = (uVar89 * 0x40000 | uVar89 >> 0xe) ^ uVar150;
    auVar104._4_4_ = iVar24;
    auVar104._0_4_ = iVar54;
    auVar104._8_4_ = iVar25;
    auVar104._12_4_ = iVar39;
    auVar101._0_4_ = (iVar54 + uVar121) * 0x80;
    auVar101._4_4_ = (iVar24 + uVar123) * 0x80;
    auVar101._8_4_ = (iVar25 + uVar149) * 0x80;
    auVar101._12_4_ = (iVar39 + uVar150) * 0x80;
    auVar139._0_4_ = iVar54 + uVar121 >> 0x19;
    auVar139._4_4_ = iVar24 + uVar123 >> 0x19;
    auVar139._8_4_ = iVar25 + uVar149 >> 0x19;
    auVar139._12_4_ = iVar39 + uVar150 >> 0x19;
    auVar139 = auVar139 ^ auVar101 ^ auVar130;
    iVar24 = auVar139._0_4_;
    iVar25 = auVar139._4_4_;
    iVar39 = auVar139._8_4_;
    iVar54 = auVar139._12_4_;
    auVar102._0_8_ = auVar115._8_8_;
    auVar102._8_4_ = iVar8;
    auVar102._12_4_ = iVar23;
    auVar116._0_4_ = (iVar24 + uVar121) * 0x200;
    auVar116._4_4_ = (iVar25 + uVar123) * 0x200;
    auVar116._8_4_ = (iVar39 + uVar149) * 0x200;
    auVar116._12_4_ = (iVar54 + uVar150) * 0x200;
    auVar131._0_4_ = iVar24 + uVar121 >> 0x17;
    auVar131._4_4_ = iVar25 + uVar123 >> 0x17;
    auVar131._8_4_ = iVar39 + uVar149 >> 0x17;
    auVar131._12_4_ = iVar54 + uVar150 >> 0x17;
    auVar131 = auVar131 ^ auVar116 ^ auVar102;
    iVar8 = auVar131._0_4_;
    iVar23 = auVar131._4_4_;
    uVar108 = auVar131._8_4_ + iVar39;
    uVar122 = auVar131._12_4_ + iVar54;
    auVar117._0_4_ = (uint)(iVar8 + iVar24) >> 0x13;
    auVar117._4_4_ = (uint)(iVar23 + iVar25) >> 0x13;
    auVar117._8_4_ = uVar108 >> 0x13;
    auVar117._12_4_ = uVar122 >> 0x13;
    auVar103._0_4_ = (iVar8 + iVar24) * 0x2000;
    auVar103._4_4_ = (iVar23 + iVar25) * 0x2000;
    auVar103._8_4_ = uVar108 * 0x2000;
    auVar103._12_4_ = uVar122 * 0x2000;
    auVar104 = (auVar103 | auVar117) ^ auVar104;
    uVar108 = auVar104._0_4_ + iVar8;
    uVar122 = auVar104._4_4_ + iVar23;
    uVar87 = auVar104._8_4_ + auVar131._8_4_;
    uVar89 = auVar104._12_4_ + auVar131._12_4_;
    auVar142._4_4_ = iVar24;
    auVar142._0_4_ = iVar54;
    auVar142._8_4_ = iVar25;
    auVar142._12_4_ = iVar39;
    uVar121 = (uVar108 * 0x40000 | uVar108 >> 0xe) ^ uVar121;
    uVar123 = (uVar122 * 0x40000 | uVar122 >> 0xe) ^ uVar123;
    uVar149 = (uVar87 * 0x40000 | uVar87 >> 0xe) ^ uVar149;
    uVar150 = (uVar89 * 0x40000 | uVar89 >> 0xe) ^ uVar150;
    auVar83._0_4_ = (iVar54 + uVar121) * 0x80;
    auVar83._4_4_ = (iVar24 + uVar123) * 0x80;
    auVar83._8_4_ = (iVar25 + uVar149) * 0x80;
    auVar83._12_4_ = (iVar39 + uVar150) * 0x80;
    auVar93._12_4_ = auVar104._0_4_;
    auVar93._0_12_ = auVar104._4_12_;
    auVar118._0_4_ = iVar54 + uVar121 >> 0x19;
    auVar118._4_4_ = iVar24 + uVar123 >> 0x19;
    auVar118._8_4_ = iVar25 + uVar149 >> 0x19;
    auVar118._12_4_ = iVar39 + uVar150 >> 0x19;
    auVar118 = auVar118 ^ auVar83 ^ auVar93;
    auVar132._0_8_ = auVar131._8_8_;
    auVar132._8_4_ = iVar8;
    auVar132._12_4_ = iVar23;
    uVar91 = auVar118._0_4_;
    uVar105 = auVar118._4_4_;
    uVar106 = auVar118._8_4_;
    uVar107 = auVar118._12_4_;
    auVar140._0_4_ = (uVar91 + uVar121) * 0x200;
    auVar140._4_4_ = (uVar105 + uVar123) * 0x200;
    auVar140._8_4_ = (uVar106 + uVar149) * 0x200;
    auVar140._12_4_ = (uVar107 + uVar150) * 0x200;
    auVar84._0_4_ = uVar91 + uVar121 >> 0x17;
    auVar84._4_4_ = uVar105 + uVar123 >> 0x17;
    auVar84._8_4_ = uVar106 + uVar149 >> 0x17;
    auVar84._12_4_ = uVar107 + uVar150 >> 0x17;
    auVar84 = auVar84 ^ auVar140 ^ auVar132;
    iVar8 = auVar84._0_4_;
    iVar23 = auVar84._4_4_;
    uVar108 = auVar84._8_4_ + uVar106;
    uVar122 = auVar84._12_4_ + uVar107;
    auVar141._0_4_ = (iVar8 + uVar91) * 0x2000;
    auVar141._4_4_ = (iVar23 + uVar105) * 0x2000;
    auVar141._8_4_ = uVar108 * 0x2000;
    auVar141._12_4_ = uVar122 * 0x2000;
    auVar133._0_4_ = iVar8 + uVar91 >> 0x13;
    auVar133._4_4_ = iVar23 + uVar105 >> 0x13;
    auVar133._8_4_ = uVar108 >> 0x13;
    auVar133._12_4_ = uVar122 >> 0x13;
    auVar142 = (auVar141 | auVar133) ^ auVar142;
    auVar134._0_12_ = auVar142._4_12_;
    auVar134._12_4_ = auVar142._0_4_;
    uVar108 = auVar142._0_4_ + iVar8;
    uVar122 = auVar142._4_4_ + iVar23;
    uVar87 = auVar142._8_4_ + auVar84._8_4_;
    uVar89 = auVar142._12_4_ + auVar84._12_4_;
    uVar121 = (uVar108 * 0x40000 | uVar108 >> 0xe) ^ uVar121;
    uVar123 = (uVar122 * 0x40000 | uVar122 >> 0xe) ^ uVar123;
    uVar149 = (uVar87 * 0x40000 | uVar87 >> 0xe) ^ uVar149;
    uVar150 = (uVar89 * 0x40000 | uVar89 >> 0xe) ^ uVar150;
    auVar157._0_4_ = (uVar107 + uVar121) * 0x80;
    auVar157._4_4_ = (uVar91 + uVar123) * 0x80;
    auVar157._8_4_ = (uVar105 + uVar149) * 0x80;
    auVar157._12_4_ = (uVar106 + uVar150) * 0x80;
    auVar119._0_4_ = uVar107 + uVar121 >> 0x19;
    auVar119._4_4_ = uVar91 + uVar123 >> 0x19;
    auVar119._8_4_ = uVar105 + uVar149 >> 0x19;
    auVar119._12_4_ = uVar106 + uVar150 >> 0x19;
    auVar119 = auVar119 ^ auVar157 ^ auVar134;
    iVar39 = auVar119._0_4_;
    iVar54 = auVar119._4_4_;
    iVar56 = auVar119._8_4_;
    iVar58 = auVar119._12_4_;
    auVar85._0_8_ = auVar84._8_8_;
    auVar85._8_4_ = iVar8;
    auVar85._12_4_ = iVar23;
    auVar158._0_4_ = (iVar39 + uVar121) * 0x200;
    auVar158._4_4_ = (iVar54 + uVar123) * 0x200;
    auVar158._8_4_ = (iVar56 + uVar149) * 0x200;
    auVar158._12_4_ = (iVar58 + uVar150) * 0x200;
    auVar135._0_4_ = iVar39 + uVar121 >> 0x17;
    auVar135._4_4_ = iVar54 + uVar123 >> 0x17;
    auVar135._8_4_ = iVar56 + uVar149 >> 0x17;
    auVar135._12_4_ = iVar58 + uVar150 >> 0x17;
    auVar135 = auVar135 ^ auVar158 ^ auVar85;
    iVar8 = auVar135._0_4_;
    iVar23 = auVar135._4_4_;
    iVar24 = auVar135._8_4_;
    iVar25 = auVar135._12_4_;
    uVar107 = ((iVar8 + iVar39) * 0x2000 | (uint)(iVar8 + iVar39) >> 0x13) ^ uVar107;
    uVar91 = ((iVar23 + iVar54) * 0x2000 | (uint)(iVar23 + iVar54) >> 0x13) ^ uVar91;
    uVar105 = ((iVar24 + iVar56) * 0x2000 | (uint)(iVar24 + iVar56) >> 0x13) ^ uVar105;
    uVar106 = ((iVar25 + iVar58) * 0x2000 | (uint)(iVar25 + iVar58) >> 0x13) ^ uVar106;
    uVar108 = uVar107 + iVar8;
    uVar122 = uVar91 + iVar23;
    uVar87 = uVar105 + iVar24;
    uVar89 = uVar106 + iVar25;
    uVar71 = ((uVar108 * 0x40000 | uVar108 >> 0xe) ^ uVar121) + uVar71;
    uVar86 = ((uVar122 * 0x40000 | uVar122 >> 0xe) ^ uVar123) + uVar86;
    uVar88 = ((uVar87 * 0x40000 | uVar87 >> 0xe) ^ uVar149) + uVar88;
    uVar90 = ((uVar89 * 0x40000 | uVar89 >> 0xe) ^ uVar150) + uVar90;
    uVar91 = uVar91 + uVar38;
    uVar105 = uVar105 + uVar53;
    uVar106 = uVar106 + uVar55;
    uVar107 = uVar107 + uVar57;
    *(uint *)pauVar5[-3] = uVar71;
    *(uint *)((long)pauVar5[-3] + 4) = uVar86;
    *(uint *)((long)pauVar5[-3] + 8) = uVar88;
    *(uint *)((long)pauVar5[-3] + 0xc) = uVar90;
    *(uint *)pauVar5[-2] = uVar91;
    *(uint *)((long)pauVar5[-2] + 4) = uVar105;
    *(uint *)((long)pauVar5[-2] + 8) = uVar106;
    *(uint *)((long)pauVar5[-2] + 0xc) = uVar107;
    auVar136._0_4_ = iVar24 + auVar40._0_4_;
    auVar136._4_4_ = iVar25 + auVar40._4_4_;
    auVar136._8_4_ = iVar8 + auVar40._8_4_;
    auVar136._12_4_ = iVar23 + auVar40._12_4_;
    auVar120._0_4_ = iVar58 + auVar59._0_4_;
    auVar120._4_4_ = iVar39 + auVar59._4_4_;
    auVar120._8_4_ = iVar54 + auVar59._8_4_;
    auVar120._12_4_ = iVar56 + auVar59._12_4_;
    pauVar5[-1] = auVar136;
    uVar71 = uVar71 ^ *(uint *)pauVar6[-3];
    uVar86 = uVar86 ^ *(uint *)(pauVar6[-3] + 4);
    uVar88 = uVar88 ^ *(uint *)(pauVar6[-3] + 8);
    uVar90 = uVar90 ^ *(uint *)(pauVar6[-3] + 0xc);
    uVar91 = uVar91 ^ *(uint *)pauVar6[-2];
    uVar105 = uVar105 ^ *(uint *)(pauVar6[-2] + 4);
    uVar106 = uVar106 ^ *(uint *)(pauVar6[-2] + 8);
    uVar107 = uVar107 ^ *(uint *)(pauVar6[-2] + 0xc);
    *pauVar5 = auVar120;
    auVar120 = auVar120 ^ *pauVar6;
    uVar38 = uVar71 + auVar120._0_4_;
    uVar53 = uVar86 + auVar120._4_4_;
    uVar55 = uVar88 + auVar120._8_4_;
    uVar57 = uVar90 + auVar120._12_4_;
    auVar136 = auVar136 ^ pauVar6[-1];
    uVar121 = (uVar38 * 0x80 | uVar38 >> 0x19) ^ uVar91;
    uVar123 = (uVar53 * 0x80 | uVar53 >> 0x19) ^ uVar105;
    uVar149 = (uVar55 * 0x80 | uVar55 >> 0x19) ^ uVar106;
    uVar150 = (uVar57 * 0x80 | uVar57 >> 0x19) ^ uVar107;
    auVar10._0_4_ = uVar121 + uVar71 >> 0x17;
    auVar10._4_4_ = uVar123 + uVar86 >> 0x17;
    auVar10._8_4_ = uVar149 + uVar88 >> 0x17;
    auVar10._12_4_ = uVar150 + uVar90 >> 0x17;
    auVar26._0_4_ = (uVar121 + uVar71) * 0x200;
    auVar26._4_4_ = (uVar123 + uVar86) * 0x200;
    auVar26._8_4_ = (uVar149 + uVar88) * 0x200;
    auVar26._12_4_ = (uVar150 + uVar90) * 0x200;
    auVar59 = (auVar26 | auVar10) ^ auVar136;
    iVar8 = auVar59._0_4_;
    iVar23 = auVar59._4_4_;
    uVar38 = auVar59._8_4_ + uVar149;
    uVar53 = auVar59._12_4_ + uVar150;
    auVar11._0_4_ = (iVar8 + uVar121) * 0x2000;
    auVar11._4_4_ = (iVar23 + uVar123) * 0x2000;
    auVar11._8_4_ = uVar38 * 0x2000;
    auVar11._12_4_ = uVar53 * 0x2000;
    auVar60._0_4_ = iVar8 + uVar121 >> 0x13;
    auVar60._4_4_ = iVar23 + uVar123 >> 0x13;
    auVar60._8_4_ = uVar38 >> 0x13;
    auVar60._12_4_ = uVar53 >> 0x13;
    auVar40 = (auVar11 | auVar60) ^ auVar120;
    auVar159._0_12_ = auVar40._4_12_;
    auVar159._12_4_ = auVar40._0_4_;
    uVar38 = auVar40._0_4_ + iVar8;
    uVar53 = auVar40._4_4_ + iVar23;
    uVar55 = auVar40._8_4_ + auVar59._8_4_;
    uVar57 = auVar40._12_4_ + auVar59._12_4_;
    uVar108 = (uVar38 * 0x40000 | uVar38 >> 0xe) ^ uVar71;
    uVar122 = (uVar53 * 0x40000 | uVar53 >> 0xe) ^ uVar86;
    uVar87 = (uVar55 * 0x40000 | uVar55 >> 0xe) ^ uVar88;
    uVar89 = (uVar57 * 0x40000 | uVar57 >> 0xe) ^ uVar90;
    auVar29._4_4_ = uVar121;
    auVar29._0_4_ = uVar150;
    auVar29._8_4_ = uVar123;
    auVar29._12_4_ = uVar149;
    auVar41._0_4_ = (uVar150 + uVar108) * 0x80;
    auVar41._4_4_ = (uVar121 + uVar122) * 0x80;
    auVar41._8_4_ = (uVar123 + uVar87) * 0x80;
    auVar41._12_4_ = (uVar149 + uVar89) * 0x80;
    auVar61._0_4_ = uVar150 + uVar108 >> 0x19;
    auVar61._4_4_ = uVar121 + uVar122 >> 0x19;
    auVar61._8_4_ = uVar123 + uVar87 >> 0x19;
    auVar61._12_4_ = uVar149 + uVar89 >> 0x19;
    auVar61 = auVar61 ^ auVar41 ^ auVar159;
    iVar24 = auVar61._0_4_;
    iVar25 = auVar61._4_4_;
    iVar39 = auVar61._8_4_;
    iVar54 = auVar61._12_4_;
    auVar27._0_8_ = auVar59._8_8_;
    auVar27._8_4_ = iVar8;
    auVar27._12_4_ = iVar23;
    auVar160._0_4_ = (iVar24 + uVar108) * 0x200;
    auVar160._4_4_ = (iVar25 + uVar122) * 0x200;
    auVar160._8_4_ = (iVar39 + uVar87) * 0x200;
    auVar160._12_4_ = (iVar54 + uVar89) * 0x200;
    auVar42._0_4_ = iVar24 + uVar108 >> 0x17;
    auVar42._4_4_ = iVar25 + uVar122 >> 0x17;
    auVar42._8_4_ = iVar39 + uVar87 >> 0x17;
    auVar42._12_4_ = iVar54 + uVar89 >> 0x17;
    auVar42 = auVar42 ^ auVar160 ^ auVar27;
    iVar8 = auVar42._0_4_;
    iVar23 = auVar42._4_4_;
    uVar38 = auVar42._8_4_ + iVar39;
    uVar53 = auVar42._12_4_ + iVar54;
    auVar161._0_4_ = (uint)(iVar8 + iVar24) >> 0x13;
    auVar161._4_4_ = (uint)(iVar23 + iVar25) >> 0x13;
    auVar161._8_4_ = uVar38 >> 0x13;
    auVar161._12_4_ = uVar53 >> 0x13;
    auVar28._0_4_ = (iVar8 + iVar24) * 0x2000;
    auVar28._4_4_ = (iVar23 + iVar25) * 0x2000;
    auVar28._8_4_ = uVar38 * 0x2000;
    auVar28._12_4_ = uVar53 * 0x2000;
    auVar29 = (auVar28 | auVar161) ^ auVar29;
    auVar162._0_12_ = auVar29._4_12_;
    auVar162._12_4_ = auVar29._0_4_;
    uVar38 = auVar29._0_4_ + iVar8;
    uVar53 = auVar29._4_4_ + iVar23;
    uVar55 = auVar29._8_4_ + auVar42._8_4_;
    uVar57 = auVar29._12_4_ + auVar42._12_4_;
    auVar15._4_4_ = iVar24;
    auVar15._0_4_ = iVar54;
    auVar15._8_4_ = iVar25;
    auVar15._12_4_ = iVar39;
    uVar108 = (uVar38 * 0x40000 | uVar38 >> 0xe) ^ uVar108;
    uVar122 = (uVar53 * 0x40000 | uVar53 >> 0xe) ^ uVar122;
    uVar87 = (uVar55 * 0x40000 | uVar55 >> 0xe) ^ uVar87;
    uVar89 = (uVar57 * 0x40000 | uVar57 >> 0xe) ^ uVar89;
    auVar12._0_4_ = (iVar54 + uVar108) * 0x80;
    auVar12._4_4_ = (iVar24 + uVar122) * 0x80;
    auVar12._8_4_ = (iVar25 + uVar87) * 0x80;
    auVar12._12_4_ = (iVar39 + uVar89) * 0x80;
    auVar62._0_4_ = iVar54 + uVar108 >> 0x19;
    auVar62._4_4_ = iVar24 + uVar122 >> 0x19;
    auVar62._8_4_ = iVar25 + uVar87 >> 0x19;
    auVar62._12_4_ = iVar39 + uVar89 >> 0x19;
    auVar62 = auVar62 ^ auVar12 ^ auVar162;
    auVar13._0_8_ = auVar42._8_8_;
    auVar13._8_4_ = iVar8;
    auVar13._12_4_ = iVar23;
    iVar24 = auVar62._0_4_;
    iVar25 = auVar62._4_4_;
    iVar39 = auVar62._8_4_;
    iVar54 = auVar62._12_4_;
    auVar163._0_4_ = (iVar24 + uVar108) * 0x200;
    auVar163._4_4_ = (iVar25 + uVar122) * 0x200;
    auVar163._8_4_ = (iVar39 + uVar87) * 0x200;
    auVar163._12_4_ = (iVar54 + uVar89) * 0x200;
    auVar43._0_4_ = iVar24 + uVar108 >> 0x17;
    auVar43._4_4_ = iVar25 + uVar122 >> 0x17;
    auVar43._8_4_ = iVar39 + uVar87 >> 0x17;
    auVar43._12_4_ = iVar54 + uVar89 >> 0x17;
    auVar43 = auVar43 ^ auVar163 ^ auVar13;
    iVar8 = auVar43._0_4_;
    iVar23 = auVar43._4_4_;
    uVar38 = auVar43._8_4_ + iVar39;
    uVar53 = auVar43._12_4_ + iVar54;
    auVar14._0_4_ = (iVar8 + iVar24) * 0x2000;
    auVar14._4_4_ = (iVar23 + iVar25) * 0x2000;
    auVar14._8_4_ = uVar38 * 0x2000;
    auVar14._12_4_ = uVar53 * 0x2000;
    auVar164._0_4_ = (uint)(iVar8 + iVar24) >> 0x13;
    auVar164._4_4_ = (uint)(iVar23 + iVar25) >> 0x13;
    auVar164._8_4_ = uVar38 >> 0x13;
    auVar164._12_4_ = uVar53 >> 0x13;
    auVar15 = (auVar14 | auVar164) ^ auVar15;
    uVar38 = auVar15._0_4_ + iVar8;
    uVar53 = auVar15._4_4_ + iVar23;
    uVar55 = auVar15._8_4_ + auVar43._8_4_;
    uVar57 = auVar15._12_4_ + auVar43._12_4_;
    uVar108 = (uVar38 * 0x40000 | uVar38 >> 0xe) ^ uVar108;
    uVar122 = (uVar53 * 0x40000 | uVar53 >> 0xe) ^ uVar122;
    uVar87 = (uVar55 * 0x40000 | uVar55 >> 0xe) ^ uVar87;
    uVar89 = (uVar57 * 0x40000 | uVar57 >> 0xe) ^ uVar89;
    auVar33._4_4_ = iVar24;
    auVar33._0_4_ = iVar54;
    auVar33._8_4_ = iVar25;
    auVar33._12_4_ = iVar39;
    auVar30._0_4_ = (iVar54 + uVar108) * 0x80;
    auVar30._4_4_ = (iVar24 + uVar122) * 0x80;
    auVar30._8_4_ = (iVar25 + uVar87) * 0x80;
    auVar30._12_4_ = (iVar39 + uVar89) * 0x80;
    auVar143._0_4_ = iVar54 + uVar108 >> 0x19;
    auVar143._4_4_ = iVar24 + uVar122 >> 0x19;
    auVar143._8_4_ = iVar25 + uVar87 >> 0x19;
    auVar143._12_4_ = iVar39 + uVar89 >> 0x19;
    auVar3._12_4_ = auVar15._0_4_;
    auVar3._0_12_ = auVar15._4_12_;
    auVar143 = auVar143 ^ auVar30 ^ auVar3;
    iVar24 = auVar143._0_4_;
    iVar25 = auVar143._4_4_;
    iVar39 = auVar143._8_4_;
    iVar54 = auVar143._12_4_;
    auVar31._0_8_ = auVar43._8_8_;
    auVar31._8_4_ = iVar8;
    auVar31._12_4_ = iVar23;
    auVar44._0_4_ = (iVar24 + uVar108) * 0x200;
    auVar44._4_4_ = (iVar25 + uVar122) * 0x200;
    auVar44._8_4_ = (iVar39 + uVar87) * 0x200;
    auVar44._12_4_ = (iVar54 + uVar89) * 0x200;
    auVar63._0_4_ = iVar24 + uVar108 >> 0x17;
    auVar63._4_4_ = iVar25 + uVar122 >> 0x17;
    auVar63._8_4_ = iVar39 + uVar87 >> 0x17;
    auVar63._12_4_ = iVar54 + uVar89 >> 0x17;
    auVar63 = auVar63 ^ auVar44 ^ auVar31;
    iVar8 = auVar63._0_4_;
    iVar23 = auVar63._4_4_;
    uVar38 = auVar63._8_4_ + iVar39;
    uVar53 = auVar63._12_4_ + iVar54;
    auVar45._0_4_ = (uint)(iVar8 + iVar24) >> 0x13;
    auVar45._4_4_ = (uint)(iVar23 + iVar25) >> 0x13;
    auVar45._8_4_ = uVar38 >> 0x13;
    auVar45._12_4_ = uVar53 >> 0x13;
    auVar32._0_4_ = (iVar8 + iVar24) * 0x2000;
    auVar32._4_4_ = (iVar23 + iVar25) * 0x2000;
    auVar32._8_4_ = uVar38 * 0x2000;
    auVar32._12_4_ = uVar53 * 0x2000;
    auVar33 = (auVar32 | auVar45) ^ auVar33;
    auVar46._0_12_ = auVar33._4_12_;
    auVar46._12_4_ = auVar33._0_4_;
    uVar38 = auVar33._0_4_ + iVar8;
    uVar53 = auVar33._4_4_ + iVar23;
    uVar55 = auVar33._8_4_ + auVar63._8_4_;
    uVar57 = auVar33._12_4_ + auVar63._12_4_;
    auVar19._4_4_ = iVar24;
    auVar19._0_4_ = iVar54;
    auVar19._8_4_ = iVar25;
    auVar19._12_4_ = iVar39;
    uVar108 = (uVar38 * 0x40000 | uVar38 >> 0xe) ^ uVar108;
    uVar122 = (uVar53 * 0x40000 | uVar53 >> 0xe) ^ uVar122;
    uVar87 = (uVar55 * 0x40000 | uVar55 >> 0xe) ^ uVar87;
    uVar89 = (uVar57 * 0x40000 | uVar57 >> 0xe) ^ uVar89;
    auVar16._0_4_ = (iVar54 + uVar108) * 0x80;
    auVar16._4_4_ = (iVar24 + uVar122) * 0x80;
    auVar16._8_4_ = (iVar25 + uVar87) * 0x80;
    auVar16._12_4_ = (iVar39 + uVar89) * 0x80;
    auVar144._0_4_ = iVar54 + uVar108 >> 0x19;
    auVar144._4_4_ = iVar24 + uVar122 >> 0x19;
    auVar144._8_4_ = iVar25 + uVar87 >> 0x19;
    auVar144._12_4_ = iVar39 + uVar89 >> 0x19;
    auVar144 = auVar144 ^ auVar16 ^ auVar46;
    auVar17._0_8_ = auVar63._8_8_;
    auVar17._8_4_ = iVar8;
    auVar17._12_4_ = iVar23;
    iVar24 = auVar144._0_4_;
    iVar25 = auVar144._4_4_;
    iVar39 = auVar144._8_4_;
    iVar54 = auVar144._12_4_;
    auVar64._0_4_ = (iVar24 + uVar108) * 0x200;
    auVar64._4_4_ = (iVar25 + uVar122) * 0x200;
    auVar64._8_4_ = (iVar39 + uVar87) * 0x200;
    auVar64._12_4_ = (iVar54 + uVar89) * 0x200;
    auVar47._0_4_ = iVar24 + uVar108 >> 0x17;
    auVar47._4_4_ = iVar25 + uVar122 >> 0x17;
    auVar47._8_4_ = iVar39 + uVar87 >> 0x17;
    auVar47._12_4_ = iVar54 + uVar89 >> 0x17;
    auVar47 = auVar47 ^ auVar64 ^ auVar17;
    iVar8 = auVar47._0_4_;
    iVar23 = auVar47._4_4_;
    uVar38 = auVar47._8_4_ + iVar39;
    uVar53 = auVar47._12_4_ + iVar54;
    auVar18._0_4_ = (iVar8 + iVar24) * 0x2000;
    auVar18._4_4_ = (iVar23 + iVar25) * 0x2000;
    auVar18._8_4_ = uVar38 * 0x2000;
    auVar18._12_4_ = uVar53 * 0x2000;
    auVar65._0_4_ = (uint)(iVar8 + iVar24) >> 0x13;
    auVar65._4_4_ = (uint)(iVar23 + iVar25) >> 0x13;
    auVar65._8_4_ = uVar38 >> 0x13;
    auVar65._12_4_ = uVar53 >> 0x13;
    auVar19 = (auVar18 | auVar65) ^ auVar19;
    auVar66._0_12_ = auVar19._4_12_;
    auVar66._12_4_ = auVar19._0_4_;
    uVar38 = auVar19._0_4_ + iVar8;
    uVar53 = auVar19._4_4_ + iVar23;
    uVar55 = auVar19._8_4_ + auVar47._8_4_;
    uVar57 = auVar19._12_4_ + auVar47._12_4_;
    uVar108 = (uVar38 * 0x40000 | uVar38 >> 0xe) ^ uVar108;
    uVar122 = (uVar53 * 0x40000 | uVar53 >> 0xe) ^ uVar122;
    uVar87 = (uVar55 * 0x40000 | uVar55 >> 0xe) ^ uVar87;
    uVar89 = (uVar57 * 0x40000 | uVar57 >> 0xe) ^ uVar89;
    auVar37._4_4_ = iVar24;
    auVar37._0_4_ = iVar54;
    auVar37._8_4_ = iVar25;
    auVar37._12_4_ = iVar39;
    auVar34._0_4_ = (iVar54 + uVar108) * 0x80;
    auVar34._4_4_ = (iVar24 + uVar122) * 0x80;
    auVar34._8_4_ = (iVar25 + uVar87) * 0x80;
    auVar34._12_4_ = (iVar39 + uVar89) * 0x80;
    auVar145._0_4_ = iVar54 + uVar108 >> 0x19;
    auVar145._4_4_ = iVar24 + uVar122 >> 0x19;
    auVar145._8_4_ = iVar25 + uVar87 >> 0x19;
    auVar145._12_4_ = iVar39 + uVar89 >> 0x19;
    auVar145 = auVar145 ^ auVar34 ^ auVar66;
    iVar24 = auVar145._0_4_;
    iVar25 = auVar145._4_4_;
    iVar39 = auVar145._8_4_;
    iVar54 = auVar145._12_4_;
    auVar35._0_8_ = auVar47._8_8_;
    auVar35._8_4_ = iVar8;
    auVar35._12_4_ = iVar23;
    auVar48._0_4_ = (iVar24 + uVar108) * 0x200;
    auVar48._4_4_ = (iVar25 + uVar122) * 0x200;
    auVar48._8_4_ = (iVar39 + uVar87) * 0x200;
    auVar48._12_4_ = (iVar54 + uVar89) * 0x200;
    auVar67._0_4_ = iVar24 + uVar108 >> 0x17;
    auVar67._4_4_ = iVar25 + uVar122 >> 0x17;
    auVar67._8_4_ = iVar39 + uVar87 >> 0x17;
    auVar67._12_4_ = iVar54 + uVar89 >> 0x17;
    auVar67 = auVar67 ^ auVar48 ^ auVar35;
    iVar8 = auVar67._0_4_;
    iVar23 = auVar67._4_4_;
    uVar38 = auVar67._8_4_ + iVar39;
    uVar53 = auVar67._12_4_ + iVar54;
    auVar49._0_4_ = (uint)(iVar8 + iVar24) >> 0x13;
    auVar49._4_4_ = (uint)(iVar23 + iVar25) >> 0x13;
    auVar49._8_4_ = uVar38 >> 0x13;
    auVar49._12_4_ = uVar53 >> 0x13;
    auVar36._0_4_ = (iVar8 + iVar24) * 0x2000;
    auVar36._4_4_ = (iVar23 + iVar25) * 0x2000;
    auVar36._8_4_ = uVar38 * 0x2000;
    auVar36._12_4_ = uVar53 * 0x2000;
    auVar37 = (auVar36 | auVar49) ^ auVar37;
    uVar38 = auVar37._0_4_ + iVar8;
    uVar53 = auVar37._4_4_ + iVar23;
    uVar55 = auVar37._8_4_ + auVar67._8_4_;
    uVar57 = auVar37._12_4_ + auVar67._12_4_;
    auVar148._4_4_ = iVar24;
    auVar148._0_4_ = iVar54;
    auVar148._8_4_ = iVar25;
    auVar148._12_4_ = iVar39;
    uVar108 = (uVar38 * 0x40000 | uVar38 >> 0xe) ^ uVar108;
    uVar122 = (uVar53 * 0x40000 | uVar53 >> 0xe) ^ uVar122;
    uVar87 = (uVar55 * 0x40000 | uVar55 >> 0xe) ^ uVar87;
    uVar89 = (uVar57 * 0x40000 | uVar57 >> 0xe) ^ uVar89;
    auVar20._0_4_ = (iVar54 + uVar108) * 0x80;
    auVar20._4_4_ = (iVar24 + uVar122) * 0x80;
    auVar20._8_4_ = (iVar25 + uVar87) * 0x80;
    auVar20._12_4_ = (iVar39 + uVar89) * 0x80;
    auVar4._12_4_ = auVar37._0_4_;
    auVar4._0_12_ = auVar37._4_12_;
    auVar50._0_4_ = iVar54 + uVar108 >> 0x19;
    auVar50._4_4_ = iVar24 + uVar122 >> 0x19;
    auVar50._8_4_ = iVar25 + uVar87 >> 0x19;
    auVar50._12_4_ = iVar39 + uVar89 >> 0x19;
    auVar50 = auVar50 ^ auVar20 ^ auVar4;
    auVar68._0_8_ = auVar67._8_8_;
    auVar68._8_4_ = iVar8;
    auVar68._12_4_ = iVar23;
    uVar38 = auVar50._0_4_;
    uVar53 = auVar50._4_4_;
    uVar55 = auVar50._8_4_;
    uVar57 = auVar50._12_4_;
    auVar146._0_4_ = (uVar38 + uVar108) * 0x200;
    auVar146._4_4_ = (uVar53 + uVar122) * 0x200;
    auVar146._8_4_ = (uVar55 + uVar87) * 0x200;
    auVar146._12_4_ = (uVar57 + uVar89) * 0x200;
    auVar21._0_4_ = uVar38 + uVar108 >> 0x17;
    auVar21._4_4_ = uVar53 + uVar122 >> 0x17;
    auVar21._8_4_ = uVar55 + uVar87 >> 0x17;
    auVar21._12_4_ = uVar57 + uVar89 >> 0x17;
    auVar21 = auVar21 ^ auVar146 ^ auVar68;
    iVar8 = auVar21._0_4_;
    iVar23 = auVar21._4_4_;
    uVar121 = auVar21._8_4_ + uVar55;
    uVar123 = auVar21._12_4_ + uVar57;
    auVar147._0_4_ = (iVar8 + uVar38) * 0x2000;
    auVar147._4_4_ = (iVar23 + uVar53) * 0x2000;
    auVar147._8_4_ = uVar121 * 0x2000;
    auVar147._12_4_ = uVar123 * 0x2000;
    auVar69._0_4_ = iVar8 + uVar38 >> 0x13;
    auVar69._4_4_ = iVar23 + uVar53 >> 0x13;
    auVar69._8_4_ = uVar121 >> 0x13;
    auVar69._12_4_ = uVar123 >> 0x13;
    auVar148 = (auVar147 | auVar69) ^ auVar148;
    auVar165._0_12_ = auVar148._4_12_;
    auVar165._12_4_ = auVar148._0_4_;
    uVar121 = auVar148._0_4_ + iVar8;
    uVar123 = auVar148._4_4_ + iVar23;
    uVar149 = auVar148._8_4_ + auVar21._8_4_;
    uVar150 = auVar148._12_4_ + auVar21._12_4_;
    uVar108 = (uVar121 * 0x40000 | uVar121 >> 0xe) ^ uVar108;
    uVar122 = (uVar123 * 0x40000 | uVar123 >> 0xe) ^ uVar122;
    uVar87 = (uVar149 * 0x40000 | uVar149 >> 0xe) ^ uVar87;
    uVar89 = (uVar150 * 0x40000 | uVar150 >> 0xe) ^ uVar89;
    auVar51._0_4_ = (uVar57 + uVar108) * 0x80;
    auVar51._4_4_ = (uVar38 + uVar122) * 0x80;
    auVar51._8_4_ = (uVar53 + uVar87) * 0x80;
    auVar51._12_4_ = (uVar55 + uVar89) * 0x80;
    auVar70._0_4_ = uVar57 + uVar108 >> 0x19;
    auVar70._4_4_ = uVar38 + uVar122 >> 0x19;
    auVar70._8_4_ = uVar53 + uVar87 >> 0x19;
    auVar70._12_4_ = uVar55 + uVar89 >> 0x19;
    auVar70 = auVar70 ^ auVar51 ^ auVar165;
    iVar39 = auVar70._0_4_;
    iVar54 = auVar70._4_4_;
    iVar56 = auVar70._8_4_;
    iVar58 = auVar70._12_4_;
    auVar22._0_8_ = auVar21._8_8_;
    auVar22._8_4_ = iVar8;
    auVar22._12_4_ = iVar23;
    auVar166._0_4_ = (iVar39 + uVar108) * 0x200;
    auVar166._4_4_ = (iVar54 + uVar122) * 0x200;
    auVar166._8_4_ = (iVar56 + uVar87) * 0x200;
    auVar166._12_4_ = (iVar58 + uVar89) * 0x200;
    auVar52._0_4_ = iVar39 + uVar108 >> 0x17;
    auVar52._4_4_ = iVar54 + uVar122 >> 0x17;
    auVar52._8_4_ = iVar56 + uVar87 >> 0x17;
    auVar52._12_4_ = iVar58 + uVar89 >> 0x17;
    auVar52 = auVar52 ^ auVar166 ^ auVar22;
    iVar8 = auVar52._0_4_;
    iVar23 = auVar52._4_4_;
    iVar24 = auVar52._8_4_;
    iVar25 = auVar52._12_4_;
    uVar57 = ((iVar8 + iVar39) * 0x2000 | (uint)(iVar8 + iVar39) >> 0x13) ^ uVar57;
    uVar38 = ((iVar23 + iVar54) * 0x2000 | (uint)(iVar23 + iVar54) >> 0x13) ^ uVar38;
    uVar53 = ((iVar24 + iVar56) * 0x2000 | (uint)(iVar24 + iVar56) >> 0x13) ^ uVar53;
    uVar55 = ((iVar25 + iVar58) * 0x2000 | (uint)(iVar25 + iVar58) >> 0x13) ^ uVar55;
    uVar121 = uVar57 + iVar8;
    uVar123 = uVar38 + iVar23;
    uVar149 = uVar53 + iVar24;
    uVar150 = uVar55 + iVar25;
    uVar9 = ((uVar121 * 0x40000 | uVar121 >> 0xe) ^ uVar108) + uVar71;
    uVar86 = ((uVar123 * 0x40000 | uVar123 >> 0xe) ^ uVar122) + uVar86;
    uVar88 = ((uVar149 * 0x40000 | uVar149 >> 0xe) ^ uVar87) + uVar88;
    uVar90 = ((uVar150 * 0x40000 | uVar150 >> 0xe) ^ uVar89) + uVar90;
    uVar38 = uVar38 + uVar91;
    uVar53 = uVar53 + uVar105;
    uVar55 = uVar55 + uVar106;
    uVar57 = uVar57 + uVar107;
    pauVar2 = pauVar5 + r * 4 + -3;
    *(uint32_t *)*pauVar2 = uVar9;
    *(uint *)((long)*pauVar2 + 4) = uVar86;
    *(uint *)((long)*pauVar2 + 8) = uVar88;
    *(uint *)((long)*pauVar2 + 0xc) = uVar90;
    pauVar2 = pauVar5 + r * 4 + -2;
    *(uint *)*pauVar2 = uVar38;
    *(uint *)((long)*pauVar2 + 4) = uVar53;
    *(uint *)((long)*pauVar2 + 8) = uVar55;
    *(uint *)((long)*pauVar2 + 0xc) = uVar57;
    auVar40._0_4_ = iVar24 + auVar136._0_4_;
    auVar40._4_4_ = iVar25 + auVar136._4_4_;
    auVar40._8_4_ = iVar8 + auVar136._8_4_;
    auVar40._12_4_ = iVar23 + auVar136._12_4_;
    auVar59._0_4_ = iVar58 + auVar120._0_4_;
    auVar59._4_4_ = iVar39 + auVar120._4_4_;
    auVar59._8_4_ = iVar54 + auVar120._8_4_;
    auVar59._12_4_ = iVar56 + auVar120._12_4_;
    pauVar5[r * 4 + -1] = auVar40;
    pauVar5[r * 4] = auVar59;
    pauVar5 = pauVar5 + 4;
    pauVar6 = pauVar6 + 8;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  return;
}

Assistant:

static void
blockmix_salsa8(const salsa20_blk_t *restrict Bin,
    salsa20_blk_t *restrict Bout, size_t r)
{
	size_t i;
	__m128i X0, X1, X2, X3;

	r--;
	PREFETCH(&Bin[r * 2 + 1], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin[i * 2 + 1], _MM_HINT_T0)
	}
	PREFETCH(&Bin[r * 2], _MM_HINT_T0)

	/* 1: X <-- B_{2r - 1} */
	X0 = Bin[r * 2 + 1].q[0];
	X1 = Bin[r * 2 + 1].q[1];
	X2 = Bin[r * 2 + 1].q[2];
	X3 = Bin[r * 2 + 1].q[3];

	/* 2: for i = 0 to 2r - 1 do */
	for (i = 0; i <= r; i++) {
		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		SALSA20_8_XOR_MEM(Bin[i * 2].q, Bout[i].q)

		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		SALSA20_8_XOR_MEM(Bin[i * 2 + 1].q, Bout[r + 1 + i].q)
	}
}